

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# product_fe_space.h
# Opt level: O3

void __thiscall
projects::dpg::ProductUniformFESpace<double>::ProductUniformFESpace
          (ProductUniformFESpace<double> *this,shared_ptr<const_lf::mesh::Mesh> *mesh_p,
          vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
          *rfs_tria_v,
          vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
          *rfs_quad_v,
          vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
          *rfs_edge_v,
          vector<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
          *rfs_point_v)

{
  EVP_PKEY_CTX *ctx;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer psVar3;
  
  this->_vptr_ProductUniformFESpace = (_func_int **)&PTR__ProductUniformFESpace_003c51d0;
  (this->mesh_p_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (mesh_p->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (mesh_p->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (mesh_p->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->mesh_p_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar1;
  (this->mesh_p_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  (mesh_p->super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  psVar3 = (rfs_tria_v->
           super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->rfs_tria_v_).
  super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (rfs_tria_v->
       super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->rfs_tria_v_).
  super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = psVar3;
  ctx = (EVP_PKEY_CTX *)
        (rfs_tria_v->
        super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->rfs_tria_v_).
  super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)ctx;
  (rfs_tria_v->
  super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (rfs_tria_v->
  super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (rfs_tria_v->
  super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  psVar3 = (rfs_quad_v->
           super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->rfs_quad_v_).
  super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (rfs_quad_v->
       super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->rfs_quad_v_).
  super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = psVar3;
  (this->rfs_quad_v_).
  super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (rfs_quad_v->
       super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (rfs_quad_v->
  super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (rfs_quad_v->
  super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (rfs_quad_v->
  super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  psVar3 = (rfs_edge_v->
           super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->rfs_edge_v_).
  super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (rfs_edge_v->
       super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->rfs_edge_v_).
  super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = psVar3;
  (this->rfs_edge_v_).
  super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (rfs_edge_v->
       super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (rfs_edge_v->
  super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (rfs_edge_v->
  super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (rfs_edge_v->
  super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  psVar3 = (rfs_point_v->
           super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->rfs_point_v_).
  super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (rfs_point_v->
       super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->rfs_point_v_).
  super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = psVar3;
  (this->rfs_point_v_).
  super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (rfs_point_v->
       super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (rfs_point_v->
  super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (rfs_point_v->
  super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (rfs_point_v->
  super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dofh_p_)._M_t.
  super___uniq_ptr_impl<projects::dpg::ProductUniformFEDofHandler,_std::default_delete<projects::dpg::ProductUniformFEDofHandler>_>
  ._M_t.
  super__Tuple_impl<0UL,_projects::dpg::ProductUniformFEDofHandler_*,_std::default_delete<projects::dpg::ProductUniformFEDofHandler>_>
  .super__Head_base<0UL,_projects::dpg::ProductUniformFEDofHandler_*,_false>._M_head_impl =
       (ProductUniformFEDofHandler *)0x0;
  (this->num_rsf_quad_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->num_rsf_quad_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->num_rsf_tria_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->num_rsf_quad_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->num_rsf_tria_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->num_rsf_tria_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->num_rsf_edge_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->num_rsf_edge_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->num_rsf_node_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->num_rsf_edge_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->num_rsf_node_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->num_rsf_node_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->numComponents_ =
       (size_type)
       ((ulong)((long)(this->rfs_tria_v_).
                      super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->rfs_tria_v_).
                     super__Vector_base<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>,_std::allocator<std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) >> 4);
  init(this,ctx);
  return;
}

Assistant:

ProductUniformFESpace(
      std::shared_ptr<const lf::mesh::Mesh> mesh_p,
      std::vector<
          std::shared_ptr<const lf::fe::ScalarReferenceFiniteElement<SCALAR>>>
          rfs_tria_v,
      std::vector<
          std::shared_ptr<const lf::fe::ScalarReferenceFiniteElement<SCALAR>>>
          rfs_quad_v,
      std::vector<
          std::shared_ptr<const lf::fe::ScalarReferenceFiniteElement<SCALAR>>>
          rfs_edge_v,
      std::vector<
          std::shared_ptr<const lf::fe::ScalarReferenceFiniteElement<SCALAR>>>
          rfs_point_v)
      : mesh_p_(std::move(mesh_p)),
        rfs_tria_v_(std::move(rfs_tria_v)),
        rfs_quad_v_(std::move(rfs_quad_v)),
        rfs_edge_v_(std::move(rfs_edge_v)),
        rfs_point_v_(std::move(rfs_point_v)) {
    numComponents_ = rfs_tria_v_.size();
    init();
  }